

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

QStringList * __thiscall Parser::findEnumValues(Parser *this,QString *name,QStringList *includes)

{
  CaseSensitivity CVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  QFlags<QIODeviceBase::OpenModeFlag> QVar5;
  uint uVar6;
  QString *pQVar7;
  qsizetype qVar8;
  int __oflag;
  QStringBuilder<QString_&,_QLatin1Char> *in_RDX;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<QString_&,_QLatin1Char> QVar9;
  QString *e;
  QStringList *__range5;
  int end;
  int begin;
  bool found;
  int i;
  bool valid;
  int pos;
  QString *filename;
  QStringList *__range1;
  QStringList *ret;
  char16_t *str;
  char16_t *str_1;
  char16_t *str_2;
  QString trimmed;
  const_iterator __end5;
  const_iterator __begin5;
  QStringList enums;
  QString block;
  QString n_1;
  QRegularExpressionMatch match_1;
  QRegularExpressionMatchIterator m_1;
  QRegularExpression macro_1;
  QString n;
  QRegularExpressionMatch match;
  QRegularExpressionMatchIterator m;
  QRegularExpression macro;
  QString line;
  QTextStream stream;
  QString data;
  QFile input;
  const_iterator __end1;
  const_iterator __begin1;
  QString enumName;
  QStringList split;
  int in_stack_fffffffffffffc78;
  CaseSensitivity in_stack_fffffffffffffc7c;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffc80;
  QIODevice *in_stack_fffffffffffffc88;
  QString *in_stack_fffffffffffffc90;
  QString *in_stack_fffffffffffffc98;
  QStringList *a;
  QString *in_stack_fffffffffffffcb8;
  QString *in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc8;
  QFlagsStorage<Qt::SplitBehaviorFlags> in_stack_fffffffffffffccc;
  char local_32d;
  int local_32c;
  int local_324;
  int local_320;
  QFlagsStorage<QRegularExpression::MatchOption> matchOptions;
  QLatin1Char local_293 [3];
  undefined8 local_290;
  undefined8 local_288;
  undefined8 local_280;
  QString *local_278;
  const_iterator local_270;
  const_iterator local_268;
  QLatin1Char local_25b [3];
  QString local_258;
  undefined8 local_240;
  undefined8 local_238;
  undefined8 local_230;
  QLatin1Char local_227 [4];
  QLatin1Char local_223 [3];
  undefined8 local_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined8 local_208;
  undefined8 local_1f8;
  QArrayDataPointer<char16_t> local_1e8 [2];
  undefined8 local_1b8;
  QLatin1Char local_1ab [32];
  QLatin1Char local_18b [3];
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_160;
  QArrayDataPointer<char16_t> local_150 [2];
  undefined8 local_120;
  QString *local_118;
  char local_110;
  undefined1 local_101 [25];
  QString local_e8;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  QFile local_a8;
  QString *local_98;
  const_iterator local_90;
  const_iterator local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  QArrayDataPointer<char16_t> local_60 [2];
  QList<QString> local_30;
  QString *local_18;
  char local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_30.d.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
  local_30.d.size = -0x5555555555555556;
  a = in_RDI;
  QArrayDataPointer<char16_t>::QArrayDataPointer(local_60,(Data *)0x0,L"::",2);
  QString::QString((QString *)in_stack_fffffffffffffc80,
                   (DataPointer *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  QFlags<Qt::SplitBehaviorFlags>::QFlags
            ((QFlags<Qt::SplitBehaviorFlags> *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
  QString::split((QString *)in_RDI,in_stack_fffffffffffffc98,
                 (SplitBehavior)in_stack_fffffffffffffccc.i,
                 (CaseSensitivity)((ulong)in_stack_fffffffffffffc90 >> 0x20));
  QString::~QString((QString *)0x10b808);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffc80);
  local_80 = 0xaaaaaaaaaaaaaaaa;
  local_78 = 0xaaaaaaaaaaaaaaaa;
  local_70 = 0xaaaaaaaaaaaaaaaa;
  QList<QString>::last
            ((QList<QString> *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  QString::QString((QString *)in_stack_fffffffffffffc80,
                   (QString *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  bVar4 = false;
  (a->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (a->d).ptr = (QString *)0xaaaaaaaaaaaaaaaa;
  (a->d).size = -0x5555555555555556;
  QList<QString>::QList((QList<QString> *)0x10b891);
  local_88.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_88 = QList<QString>::begin((QList<QString> *)in_stack_fffffffffffffc80);
  local_90.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_90 = QList<QString>::end((QList<QString> *)in_stack_fffffffffffffc80);
  while( true ) {
    local_98 = local_90.i;
    bVar2 = QList<QString>::const_iterator::operator!=(&local_88,local_90);
    if (!bVar2) break;
    pQVar7 = QList<QString>::const_iterator::operator*(&local_88);
    local_a8.super_QFileDevice.super_QIODevice._vptr_QIODevice = (_func_int **)0xaaaaaaaaaaaaaaaa;
    local_a8.super_QFileDevice.super_QIODevice.d_ptr._M_t.
    super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
    super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
    super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl =
         (__uniq_ptr_data<QIODevicePrivate,_std::default_delete<QIODevicePrivate>,_true,_true>)
         (__uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>)
         0xaaaaaaaaaaaaaaaa;
    QFile::QFile((QFile *)in_stack_fffffffffffffc90,(QString *)in_stack_fffffffffffffc88);
    QVar5 = operator|((enum_type)((ulong)in_stack_fffffffffffffc80 >> 0x20),
                      (enum_type)in_stack_fffffffffffffc80);
    uVar6 = QFile::open(&local_a8,
                        (char *)(ulong)(uint)QVar5.
                                             super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>
                                             .super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i,
                        __oflag);
    if ((uVar6 & 1) == 0) {
      bVar4 = true;
      local_320 = 1;
    }
    else {
      local_c0 = 0xaaaaaaaaaaaaaaaa;
      local_b8 = 0xaaaaaaaaaaaaaaaa;
      local_b0 = 0xaaaaaaaaaaaaaaaa;
      QString::QString((QString *)0x10b9e5);
      local_c8 = 0xaaaaaaaaaaaaaaaa;
      QTextStream::QTextStream((QTextStream *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      while (bVar2 = QTextStream::atEnd((QTextStream *)in_stack_fffffffffffffc80),
            ((bVar2 ^ 0xffU) & 1) != 0) {
        local_e8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_e8.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        local_e8.d.size = -0x5555555555555556;
        in_stack_fffffffffffffc88 = (QIODevice *)(local_101 + 1);
        QTextStream::readLine
                  ((QTextStream *)in_stack_fffffffffffffc98,(qint64)in_stack_fffffffffffffc90);
        in_stack_fffffffffffffc90 = &local_e8;
        QString::trimmed((QString *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
        QString::~QString((QString *)0x10ba81);
        in_stack_fffffffffffffc98 = (QString *)local_101;
        QLatin1Char::QLatin1Char((QLatin1Char *)in_stack_fffffffffffffc98,'\n');
        QVar9 = ::operator+((QString *)in_stack_fffffffffffffc88,
                            (QLatin1Char *)in_stack_fffffffffffffc80);
        local_118 = QVar9.a;
        local_110 = (char)QVar9.b.ch;
        local_18 = local_118;
        local_10 = local_110;
        operator+=((QString *)a,in_RDX);
        QString::~QString((QString *)0x10baf6);
      }
      simplifyData((QString *)CONCAT44(in_stack_fffffffffffffccc.i,in_stack_fffffffffffffcc8));
      local_324 = 0;
      bVar2 = true;
      local_32c = 0;
      while( true ) {
        in_stack_fffffffffffffc80 = (QArrayDataPointer<char16_t> *)(long)local_32c;
        qVar8 = QList<QString>::size(&local_30);
        matchOptions.i = (Int)((ulong)pQVar7 >> 0x20);
        if (qVar8 + -1 <= (long)in_stack_fffffffffffffc80) break;
        local_120 = 0xaaaaaaaaaaaaaaaa;
        QArrayDataPointer<char16_t>::QArrayDataPointer
                  (local_150,(Data *)0x0,
                   L"(struct|class|namespace) +([A-Za-z0-9_]*)? +([A-Za-z0-9]*;?)",0x3c);
        QString::QString((QString *)in_stack_fffffffffffffc80,
                         (DataPointer *)
                         CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
        QFlags<QRegularExpression::PatternOption>::QFlags
                  ((QFlags<QRegularExpression::PatternOption> *)in_stack_fffffffffffffc80,
                   in_stack_fffffffffffffc7c);
        QRegularExpression::QRegularExpression
                  ((QRegularExpression *)in_stack_fffffffffffffc90,
                   (QString *)in_stack_fffffffffffffc88,
                   (QFlagsStorageHelper<QRegularExpression::PatternOption,_4>)
                   SUB84((ulong)in_stack_fffffffffffffc98 >> 0x20,0));
        QString::~QString((QString *)0x10bbf2);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffc80);
        local_160 = 0xaaaaaaaaaaaaaaaa;
        QFlags<QRegularExpression::MatchOption>::QFlags
                  ((QFlags<QRegularExpression::MatchOption> *)in_stack_fffffffffffffc80,
                   in_stack_fffffffffffffc7c);
        QRegularExpression::globalMatch
                  ((QRegularExpression *)
                   CONCAT44(in_stack_fffffffffffffccc.i,in_stack_fffffffffffffcc8),
                   in_stack_fffffffffffffcc0,(qsizetype)in_stack_fffffffffffffcb8,
                   (MatchType)((ulong)a >> 0x20),
                   (QFlagsStorageHelper<QRegularExpression::MatchOption,_4>)
                   SUB84((ulong)pQVar7 >> 0x20,0));
        local_32d = '\0';
        do {
          bVar3 = QRegularExpressionMatchIterator::hasNext
                            ((QRegularExpressionMatchIterator *)0x10bc5b);
          CVar1 = in_stack_fffffffffffffc7c & 0xffffff;
          if (bVar3) {
            CVar1 = CONCAT13(local_32d,(int3)in_stack_fffffffffffffc7c) ^ 0xff000000;
          }
          in_stack_fffffffffffffc7c = CVar1;
          if ((in_stack_fffffffffffffc7c & 0x1000000) == CaseInsensitive) break;
          local_170 = 0xaaaaaaaaaaaaaaaa;
          QRegularExpressionMatchIterator::next
                    ((QRegularExpressionMatchIterator *)in_stack_fffffffffffffc98);
          local_188 = 0xaaaaaaaaaaaaaaaa;
          local_180 = 0xaaaaaaaaaaaaaaaa;
          local_178 = 0xaaaaaaaaaaaaaaaa;
          QRegularExpressionMatch::captured
                    ((QRegularExpressionMatch *)in_stack_fffffffffffffc90,
                     (int)((ulong)in_stack_fffffffffffffc88 >> 0x20));
          QLatin1Char::QLatin1Char(local_18b,';');
          QChar::QChar<QLatin1Char,_true>
                    ((QChar *)in_stack_fffffffffffffc80,
                     (QLatin1Char)(char)((ulong)in_stack_fffffffffffffc88 >> 0x38));
          bVar3 = QString::endsWith((QString *)in_stack_fffffffffffffc88,
                                    (QChar)(char16_t)((ulong)in_stack_fffffffffffffc98 >> 0x30),
                                    (CaseSensitivity)((ulong)in_stack_fffffffffffffc80 >> 0x20));
          if (bVar3) {
LAB_0010bd9d:
            bVar3 = QRegularExpressionMatch::hasCaptured
                              ((QRegularExpressionMatch *)in_stack_fffffffffffffc88,
                               (int)((ulong)in_stack_fffffffffffffc80 >> 0x20));
            if (bVar3) {
              QRegularExpressionMatch::captured
                        ((QRegularExpressionMatch *)in_stack_fffffffffffffc90,
                         (int)((ulong)in_stack_fffffffffffffc88 >> 0x20));
              QString::operator=((QString *)in_stack_fffffffffffffc80,
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
              QString::~QString((QString *)0x10bdf4);
              QLatin1Char::QLatin1Char(local_1ab,';');
              QChar::QChar<QLatin1Char,_true>
                        ((QChar *)in_stack_fffffffffffffc80,
                         (QLatin1Char)(char)((ulong)in_stack_fffffffffffffc88 >> 0x38));
              bVar3 = QString::endsWith((QString *)in_stack_fffffffffffffc88,
                                        (QChar)(char16_t)((ulong)in_stack_fffffffffffffc98 >> 0x30),
                                        (CaseSensitivity)((ulong)in_stack_fffffffffffffc80 >> 0x20))
              ;
              if (!bVar3) {
                QList<QString>::operator[]
                          ((QList<QString> *)in_stack_fffffffffffffc80,
                           CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
                bVar3 = ::operator==((QString *)in_stack_fffffffffffffc80,
                                     (QString *)
                                     CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
                if ((bVar3) &&
                   (qVar8 = QRegularExpressionMatch::capturedStart
                                      ((QRegularExpressionMatch *)in_stack_fffffffffffffc88,
                                       (int)((ulong)in_stack_fffffffffffffc80 >> 0x20)),
                   local_324 < qVar8)) {
                  qVar8 = QRegularExpressionMatch::capturedStart
                                    ((QRegularExpressionMatch *)in_stack_fffffffffffffc88,
                                     (int)((ulong)in_stack_fffffffffffffc80 >> 0x20));
                  local_324 = (int)qVar8;
                  local_32d = '\x01';
                  local_320 = 10;
                  goto LAB_0010beac;
                }
              }
            }
            local_320 = 0;
          }
          else {
            QList<QString>::operator[]
                      ((QList<QString> *)in_stack_fffffffffffffc80,
                       CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
            bVar3 = ::operator==((QString *)in_stack_fffffffffffffc80,
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
            if ((!bVar3) ||
               (qVar8 = QRegularExpressionMatch::capturedStart
                                  ((QRegularExpressionMatch *)in_stack_fffffffffffffc88,
                                   (int)((ulong)in_stack_fffffffffffffc80 >> 0x20)),
               qVar8 <= local_324)) goto LAB_0010bd9d;
            qVar8 = QRegularExpressionMatch::capturedStart
                              ((QRegularExpressionMatch *)in_stack_fffffffffffffc88,
                               (int)((ulong)in_stack_fffffffffffffc80 >> 0x20));
            local_324 = (int)qVar8;
            local_32d = '\x01';
            local_320 = 10;
          }
LAB_0010beac:
          QString::~QString((QString *)0x10beb9);
          QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)0x10bec6);
        } while (local_320 == 0);
        if (local_32d == '\0') {
          bVar2 = false;
          local_320 = 6;
        }
        else {
          local_320 = 0;
        }
        QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
                  ((QRegularExpressionMatchIterator *)0x10bf02);
        QRegularExpression::~QRegularExpression((QRegularExpression *)0x10bf0f);
        matchOptions.i = (Int)((ulong)pQVar7 >> 0x20);
        if (local_320 != 0) break;
        local_32c = local_32c + 1;
      }
      if (bVar2) {
        local_1b8 = 0xaaaaaaaaaaaaaaaa;
        QArrayDataPointer<char16_t>::QArrayDataPointer
                  (local_1e8,(Data *)0x0,L"enum +([A-Za-z0-9_]*)",0x15);
        QString::QString((QString *)in_stack_fffffffffffffc80,
                         (DataPointer *)
                         CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
        QFlags<QRegularExpression::PatternOption>::QFlags
                  ((QFlags<QRegularExpression::PatternOption> *)in_stack_fffffffffffffc80,
                   in_stack_fffffffffffffc7c);
        QRegularExpression::QRegularExpression
                  ((QRegularExpression *)in_stack_fffffffffffffc90,
                   (QString *)in_stack_fffffffffffffc88,
                   (QFlagsStorageHelper<QRegularExpression::PatternOption,_4>)
                   SUB84((ulong)in_stack_fffffffffffffc98 >> 0x20,0));
        QString::~QString((QString *)0x10bfe1);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffc80);
        local_1f8 = 0xaaaaaaaaaaaaaaaa;
        QFlags<QRegularExpression::MatchOption>::QFlags
                  ((QFlags<QRegularExpression::MatchOption> *)in_stack_fffffffffffffc80,
                   in_stack_fffffffffffffc7c);
        QRegularExpression::globalMatch
                  ((QRegularExpression *)
                   CONCAT44(in_stack_fffffffffffffccc.i,in_stack_fffffffffffffcc8),
                   in_stack_fffffffffffffcc0,(qsizetype)in_stack_fffffffffffffcb8,
                   (MatchType)((ulong)a >> 0x20),(MatchOptions)matchOptions.i);
        do {
          bVar2 = QRegularExpressionMatchIterator::hasNext
                            ((QRegularExpressionMatchIterator *)0x10c045);
          if (!bVar2) {
            local_320 = 0;
            break;
          }
          local_208 = 0xaaaaaaaaaaaaaaaa;
          QRegularExpressionMatchIterator::next
                    ((QRegularExpressionMatchIterator *)in_stack_fffffffffffffc98);
          qVar8 = QRegularExpressionMatch::capturedStart
                            ((QRegularExpressionMatch *)in_stack_fffffffffffffc88,
                             (int)((ulong)in_stack_fffffffffffffc80 >> 0x20));
          if (qVar8 < local_324) {
            local_320 = 0xb;
          }
          else {
            local_220 = 0xaaaaaaaaaaaaaaaa;
            local_218 = 0xaaaaaaaaaaaaaaaa;
            local_210 = 0xaaaaaaaaaaaaaaaa;
            QRegularExpressionMatch::captured
                      ((QRegularExpressionMatch *)in_stack_fffffffffffffc90,
                       (int)((ulong)in_stack_fffffffffffffc88 >> 0x20));
            bVar2 = ::operator==((QString *)in_stack_fffffffffffffc80,
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
            if (bVar2) {
              QLatin1Char::QLatin1Char(local_223,'{');
              QChar::QChar<QLatin1Char,_true>
                        ((QChar *)in_stack_fffffffffffffc80,
                         (QLatin1Char)(char)((ulong)in_stack_fffffffffffffc88 >> 0x38));
              QRegularExpressionMatch::capturedEnd
                        ((QRegularExpressionMatch *)in_stack_fffffffffffffc88,
                         (int)((ulong)in_stack_fffffffffffffc80 >> 0x20));
              qVar8 = QString::indexOf((QString *)in_stack_fffffffffffffc88,
                                       (QChar)(char16_t)((ulong)in_RDX >> 0x30),
                                       (qsizetype)in_stack_fffffffffffffc80,
                                       in_stack_fffffffffffffc7c);
              in_stack_fffffffffffffccc.i = (Int)qVar8;
              QLatin1Char::QLatin1Char(local_227,'}');
              QChar::QChar<QLatin1Char,_true>
                        ((QChar *)in_stack_fffffffffffffc80,
                         (QLatin1Char)(char)((ulong)in_stack_fffffffffffffc88 >> 0x38));
              qVar8 = QString::indexOf((QString *)in_stack_fffffffffffffc88,
                                       (QChar)(char16_t)((ulong)in_RDX >> 0x30),
                                       (qsizetype)in_stack_fffffffffffffc80,
                                       in_stack_fffffffffffffc7c);
              in_stack_fffffffffffffcc8 = (undefined4)qVar8;
              local_240 = 0xaaaaaaaaaaaaaaaa;
              local_238 = 0xaaaaaaaaaaaaaaaa;
              local_230 = 0xaaaaaaaaaaaaaaaa;
              QString::mid((QString *)in_RDX,(qsizetype)in_RDI,(qsizetype)in_stack_fffffffffffffc98)
              ;
              local_258.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
              local_258.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
              local_258.d.size = -0x5555555555555556;
              QLatin1Char::QLatin1Char(local_25b,'\n');
              QChar::QChar<QLatin1Char,_true>
                        ((QChar *)in_stack_fffffffffffffc80,
                         (QLatin1Char)(char)((ulong)in_stack_fffffffffffffc88 >> 0x38));
              QFlags<Qt::SplitBehaviorFlags>::QFlags
                        ((QFlags<Qt::SplitBehaviorFlags> *)in_stack_fffffffffffffc80,
                         in_stack_fffffffffffffc7c);
              QString::split(in_stack_fffffffffffffc90,
                             (QChar)(char16_t)((ulong)in_stack_fffffffffffffcb8 >> 0x30),
                             (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)
                             SUB84(in_stack_fffffffffffffcb8,0),
                             (CaseSensitivity)((ulong)in_stack_fffffffffffffc88 >> 0x20));
              in_stack_fffffffffffffcc0 = &local_258;
              local_268.i = (QString *)0xaaaaaaaaaaaaaaaa;
              local_268 = QList<QString>::begin((QList<QString> *)in_stack_fffffffffffffc80);
              local_270.i = (QString *)0xaaaaaaaaaaaaaaaa;
              local_270 = QList<QString>::end((QList<QString> *)in_stack_fffffffffffffc80);
              while( true ) {
                local_278 = local_270.i;
                bVar4 = QList<QString>::const_iterator::operator!=(&local_268,local_270);
                if (!bVar4) break;
                in_stack_fffffffffffffcb8 = QList<QString>::const_iterator::operator*(&local_268);
                local_290 = 0xaaaaaaaaaaaaaaaa;
                local_288 = 0xaaaaaaaaaaaaaaaa;
                local_280 = 0xaaaaaaaaaaaaaaaa;
                QString::trimmed((QString *)
                                 CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
                bVar4 = QString::isEmpty((QString *)0x10c381);
                if (!bVar4) {
                  QLatin1Char::QLatin1Char(local_293,'#');
                  QChar::QChar<QLatin1Char,_true>
                            ((QChar *)in_stack_fffffffffffffc80,
                             (QLatin1Char)(char)((ulong)in_stack_fffffffffffffc88 >> 0x38));
                  bVar4 = QString::startsWith((QString *)in_stack_fffffffffffffc88,
                                              (QChar)(char16_t)
                                                     ((ulong)in_stack_fffffffffffffc98 >> 0x30),
                                              (CaseSensitivity)
                                              ((ulong)in_stack_fffffffffffffc80 >> 0x20));
                  if (!bVar4) {
                    QList<QString>::operator<<
                              ((QList<QString> *)in_stack_fffffffffffffc80,
                               (parameter_type)
                               CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
                  }
                }
                QString::~QString((QString *)0x10c3e9);
                QList<QString>::const_iterator::operator++(&local_268);
              }
              bVar4 = true;
              local_320 = 1;
              QList<QString>::~QList((QList<QString> *)0x10c418);
              QString::~QString((QString *)0x10c425);
            }
            else {
              local_320 = 0;
            }
            QString::~QString((QString *)0x10c43c);
          }
          QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)0x10c449);
          in_stack_fffffffffffffc78 = local_320;
        } while ((local_320 == 0) || (local_320 == 0xb));
        QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
                  ((QRegularExpressionMatchIterator *)0x10c47e);
        QRegularExpression::~QRegularExpression((QRegularExpression *)0x10c48b);
        if (local_320 == 0) goto LAB_0010c497;
      }
      else {
LAB_0010c497:
        local_320 = 0;
      }
      QTextStream::~QTextStream((QTextStream *)in_stack_fffffffffffffc80);
      QString::~QString((QString *)0x10c4b9);
    }
    QFile::~QFile((QFile *)0x10c4c6);
    if (local_320 != 0) goto LAB_0010c4f4;
    QList<QString>::const_iterator::operator++(&local_88);
  }
  bVar4 = true;
LAB_0010c4f4:
  if (!bVar4) {
    QList<QString>::~QList((QList<QString> *)0x10c508);
  }
  QString::~QString((QString *)0x10c515);
  QList<QString>::~QList((QList<QString> *)0x10c522);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QStringList Parser::findEnumValues(const QString &name, const QStringList &includes)
{
    QStringList split = name.split(QStringLiteral("::"));
    QString enumName = split.last();
    DEBUGPRINTF(printf("searching for %s\n", qPrintable(name)));
    QStringList ret;
    for (const QString &filename : includes) {
        QFile input(filename);
        if (!input.open(QIODevice::ReadOnly | QIODevice::Text)) {
            DEBUGPRINTF(printf("Cannot open '%s' for reading: %s\n",
                                qPrintable(filename), qPrintable(input.errorString())));
            return ret;
        }
        QString data;
        QTextStream stream(&input);
        while (!stream.atEnd()) {
            QString line = stream.readLine().trimmed();
            data += line + QLatin1Char('\n');
        }
        simplifyData(data);

        int pos = 0;
        bool valid = true;
        for (int i = 0; i < split.size() - 1; i++) {
            QRegularExpression macro(QStringLiteral("(struct|class|namespace) +([A-Za-z0-9_]*)? +([A-Za-z0-9]*;?)"));
            QRegularExpressionMatchIterator m = macro.globalMatch(data);
            bool found = false;
            while (m.hasNext() && !found) {
                QRegularExpressionMatch match = m.next();
                QString n = match.captured(2);
                if (!n.endsWith(QLatin1Char(';')) && n == split[i] && match.capturedStart(2) > pos) {
                    pos = match.capturedStart(2);
                    found = true;
                    break;
                }
                if (match.hasCaptured(3)) {
                    n = match.captured(3);
                    if (!n.endsWith(QLatin1Char(';')) && n == split[i] && match.capturedStart(3) > pos) {
                        pos = match.capturedStart(3);
                        found = true;
                        break;
                    }
                }
            }
            if (!found) {
                valid = false;
                break;
            }
        }

        if (valid) {
            QRegularExpression macro(QStringLiteral("enum +([A-Za-z0-9_]*)"));
            QRegularExpressionMatchIterator m = macro.globalMatch(data);
            while (m.hasNext()) {
                QRegularExpressionMatch match = m.next();

                if (match.capturedStart() < pos)
                    continue;

                QString n = match.captured(1);

                if (n == enumName) {
                    DEBUGPRINTF(printf("Found enum: %s\n", qPrintable(n)));
                    int begin = data.indexOf(QLatin1Char('{'), match.capturedEnd());
                    int end = data.indexOf(QLatin1Char('}'), begin);
                    QString block = data.mid(begin + 1, end - begin - 1);
                    const QStringList enums = block.split(QLatin1Char('\n'));
                    for (const auto &e : enums) {
                        const auto trimmed = e.trimmed();
                        if (!trimmed.isEmpty() && !trimmed.startsWith(QLatin1Char('#')))
                            ret << trimmed;
                    }

                    return ret;
                }
            }
        }
    }
    return ret;
}